

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::ElementSelectExpression::getLongestStaticPrefixesImpl
          (ElementSelectExpression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  bool bVar1;
  ElementSelectExpression *longestStaticPrefix_00;
  
  bVar1 = isConstantSelect(this,evalContext);
  if (longestStaticPrefix == (Expression *)0x0) {
    longestStaticPrefix = &this->super_Expression;
  }
  longestStaticPrefix_00 = (ElementSelectExpression *)0x0;
  if (bVar1) {
    longestStaticPrefix_00 = (ElementSelectExpression *)longestStaticPrefix;
  }
  Expression::getLongestStaticPrefixes
            (this->value_,results,evalContext,&longestStaticPrefix_00->super_Expression);
  return;
}

Assistant:

void ElementSelectExpression::getLongestStaticPrefixesImpl(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    if (isConstantSelect(evalContext)) {
        if (!longestStaticPrefix)
            longestStaticPrefix = this;
    }
    else {
        longestStaticPrefix = nullptr;
    }

    value().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
}